

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void add_to_temp_string(c2m_ctx_t c2m_ctx,char *str)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar2 = VARR_charlength(c2m_ctx->temp_string);
  if (sVar2 != 0) {
    cVar1 = VARR_charget(c2m_ctx->temp_string,sVar2 - 1);
    if (cVar1 == '\0') {
      VARR_charpop(c2m_ctx->temp_string);
    }
  }
  sVar3 = strlen(str);
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    VARR_charpush(c2m_ctx->temp_string,str[sVar4]);
  }
  VARR_charpush(c2m_ctx->temp_string,'\0');
  return;
}

Assistant:

static void add_to_temp_string (c2m_ctx_t c2m_ctx, const char *str) {
  size_t i, len;

  if ((len = VARR_LENGTH (char, temp_string)) != 0
      && VARR_GET (char, temp_string, len - 1) == '\0') {
    VARR_POP (char, temp_string);
  }
  len = strlen (str);
  for (i = 0; i < len; i++) VARR_PUSH (char, temp_string, str[i]);
  VARR_PUSH (char, temp_string, '\0');
}